

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O3

void timeout_handler(void)

{
  pointer ptVar1;
  pthread_t local_10;
  
  ptVar1 = (global_replayer->thread_pool).
           super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(global_replayer->thread_pool).
                    super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ptVar1) < 9) {
    local_10 = (ptVar1->_M_id)._M_thread;
  }
  else {
    timeout_handler();
  }
  pthread_kill(local_10,6);
  return;
}

Assistant:

static void timeout_handler()
{
	if (global_replayer->thread_pool.size() > 1)
	{
		LOGE("Using timeout handling with more than one worker thread, cannot know which thread is the culprit.\n");
		// Just send signal to main thread so we don't emit any false positives.
		pthread_kill(pthread_self(), SIGABRT);
	}
	else
	{
		// Pretend we crashed in a safe way.
		// Send a signal to the worker thread to make sure we tear down on that thread.
		pthread_kill(global_replayer->thread_pool.front().native_handle(), SIGABRT);
	}
}